

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,DomainId *aId,Domain *aRetValue)

{
  Status SVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,JSON_DOM_abi_cxx11_,DAT_00298498 + JSON_DOM_abi_cxx11_);
  SVar1 = GetId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
                    (this,aId,aRetValue,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(DomainId const &aId, Domain &aRetValue)
{
    return GetId<Domain, DomainId>(aId, aRetValue, JSON_DOM);
}